

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateSequenceReset(Session *this,SEQNUM beginSeqNo,SEQNUM endSeqNo)

{
  Header *this_00;
  UtcTimeStampField *this_01;
  IntTConvertor<unsigned_long> *this_02;
  unsigned_long value;
  FieldBase local_240;
  string local_1e8;
  NewSeqNo newSeqNo;
  Message sequenceReset;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"4",(allocator<char> *)&local_1e8);
  MsgType::MsgType((MsgType *)&newSeqNo,(STRING *)&local_240);
  newMessage(&sequenceReset,this,(MsgType *)&newSeqNo);
  FieldBase::~FieldBase((FieldBase *)&newSeqNo);
  std::__cxx11::string::~string((string *)&local_240);
  NewSeqNo::NewSeqNo(&newSeqNo,endSeqNo);
  local_1e8._M_dataplus._M_p._0_1_ = 1;
  PossDupFlag::PossDupFlag((PossDupFlag *)&local_240,(BOOLEAN *)&local_1e8);
  this_00 = &sequenceReset.m_header;
  FieldMap::setField(&this_00->super_FieldMap,&local_240,true);
  FieldBase::~FieldBase(&local_240);
  FieldMap::setField(&sequenceReset.super_FieldMap,(FieldBase *)&newSeqNo,true);
  fill(this,this_00);
  this_01 = &FieldMap::getField<FIX::SendingTime>(&this_00->super_FieldMap)->super_UtcTimeStampField
  ;
  UtcTimeStampField::getValue((UtcTimeStamp *)&local_240,this_01);
  insertOrigSendingTime(this,this_00,(UtcTimeStamp *)&local_240);
  MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_240,beginSeqNo);
  FieldMap::setField(&this_00->super_FieldMap,&local_240,true);
  FieldBase::~FieldBase(&local_240);
  local_1e8._M_dataplus._M_p._0_1_ = 1;
  GapFillFlag::GapFillFlag((GapFillFlag *)&local_240,(BOOLEAN *)&local_1e8);
  FieldMap::setField(&sequenceReset.super_FieldMap,&local_240,true);
  FieldBase::~FieldBase(&local_240);
  sendRaw(this,&sequenceReset,beginSeqNo);
  this_02 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(&newSeqNo.super_SeqNumField);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_1e8,this_02,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240,
                 "Sent SequenceReset TO: ",&local_1e8);
  SessionState::onEvent(&this->m_state,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1e8);
  FieldBase::~FieldBase((FieldBase *)&newSeqNo);
  Message::~Message(&sequenceReset);
  return;
}

Assistant:

void Session::generateSequenceReset(SEQNUM beginSeqNo, SEQNUM endSeqNo) {
  Message sequenceReset = newMessage(MsgType(MsgType_SequenceReset));

  NewSeqNo newSeqNo(endSeqNo);
  sequenceReset.getHeader().setField(PossDupFlag(true));
  sequenceReset.setField(newSeqNo);
  fill(sequenceReset.getHeader());

  insertOrigSendingTime(sequenceReset.getHeader(), sequenceReset.getHeader().getField<SendingTime>());
  sequenceReset.getHeader().setField(MsgSeqNum(beginSeqNo));
  sequenceReset.setField(GapFillFlag(true));
  sendRaw(sequenceReset, beginSeqNo);
  m_state.onEvent("Sent SequenceReset TO: " + SEQNUM_CONVERTOR::convert(newSeqNo));
}